

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<double,unsigned_long,double>
                 (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
                 unsigned_long *Xc_indptr,MissingAction missing_action)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double dVar4;
  double dVar5;
  unsigned_long *__value;
  double dVar6;
  undefined1 auVar7 [16];
  double out;
  double v;
  double sn;
  double cnt_l;
  unsigned_long ix_1;
  unsigned_long ix;
  double xval;
  size_t cnt;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  double local_b8;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 uVar8;
  byte in_stack_ffffffffffffff5f;
  unsigned_long *in_stack_ffffffffffffff60;
  unsigned_long *Xc_indptr_00;
  ulong local_80;
  ulong local_78;
  ulong local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(long *)(in_R8 + in_RDI * 8) == *(long *)(in_R8 + 8 + in_RDI * 8)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    if (in_RSI < 2) {
      local_8 = -INFINITY;
    }
    else {
      local_68 = in_RSI;
      if (in_R9D == 0) {
        for (local_80 = *(ulong *)(in_R8 + in_RDI * 8);
            local_80 < *(ulong *)(in_R8 + 8 + in_RDI * 8); local_80 = local_80 + 1) {
          dVar5 = *(double *)(in_RDX + local_80 * 8);
          dVar4 = dVar5 * dVar5;
          local_40 = dVar5 + local_40;
          local_48 = fma(dVar5,dVar5,local_48);
          local_50 = fma(dVar4,dVar5,local_50);
          local_58 = fma(dVar4,dVar4,local_58);
        }
      }
      else {
        for (local_78 = *(ulong *)(in_R8 + in_RDI * 8);
            local_78 < *(ulong *)(in_R8 + 8 + in_RDI * 8); local_78 = local_78 + 1) {
          dVar5 = *(double *)(in_RDX + local_78 * 8);
          uVar2 = std::isnan(dVar5);
          in_stack_ffffffffffffff5f = 1;
          if ((uVar2 & 1) == 0) {
            iVar3 = std::isinf(dVar5);
            in_stack_ffffffffffffff5f = (byte)iVar3;
          }
          if ((in_stack_ffffffffffffff5f & 1) == 0) {
            dVar4 = dVar5 * dVar5;
            local_40 = dVar5 + local_40;
            local_48 = fma(dVar5,dVar5,local_48);
            local_50 = fma(dVar4,dVar5,local_50);
            local_58 = fma(dVar4,dVar4,local_58);
          }
          else {
            local_68 = local_68 - 1;
          }
        }
        if (local_68 <= in_RSI - (*(long *)(in_R8 + 8 + in_RDI * 8) - *(long *)(in_R8 + in_RDI * 8))
           ) {
          return -INFINITY;
        }
      }
      uVar8 = true;
      if (1 < local_68) {
        uVar8 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          uVar8 = local_48 == local_40 * local_40;
        }
      }
      if ((bool)uVar8 == false) {
        auVar7._8_4_ = (int)(local_68 >> 0x20);
        auVar7._0_8_ = local_68;
        auVar7._12_4_ = 0x45300000;
        dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0);
        dVar4 = local_40 / dVar5;
        __value = (unsigned_long *)(-dVar4 * dVar4 + local_48 / dVar5);
        uVar2 = std::isnan((double)__value);
        if ((uVar2 & 1) == 0) {
          Xc_indptr_00 = __value;
          dVar6 = std::numeric_limits<double>::epsilon();
          if ((dVar6 < (double)__value) ||
             (bVar1 = check_more_than_two_unique_values<double,unsigned_long>
                                ((size_t)dVar5,(size_t)dVar4,Xc_indptr_00,in_stack_ffffffffffffff60,
                                 (double *)
                                 CONCAT17(in_stack_ffffffffffffff5f,
                                          CONCAT16(uVar8,in_stack_ffffffffffffff58)),
                                 (MissingAction)((ulong)__value >> 0x20)), bVar1)) {
            if ((double)Xc_indptr_00 <= 0.0) {
              local_8 = 0.0;
            }
            else {
              local_b8 = (dVar5 * dVar4 * dVar4 * dVar4 * dVar4 +
                         -(local_40 * 4.0) * dVar4 * dVar4 * dVar4 +
                         local_48 * 6.0 * dVar4 * dVar4 + -(local_50 * 4.0) * dVar4 + local_58) /
                         (dVar5 * (double)Xc_indptr_00 * (double)Xc_indptr_00);
              uVar2 = std::isnan(local_b8);
              if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(local_b8), (uVar2 & 1) == 0)) {
                if (local_b8 <= 0.0) {
                  local_b8 = 0.0;
                }
              }
              else {
                local_b8 = -INFINITY;
              }
              local_8 = local_b8;
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = -INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}